

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.h
# Opt level: O2

int __thiscall cbtUnionFind::find(cbtUnionFind *this,int x)

{
  int iVar1;
  cbtElement *pcVar2;
  
  pcVar2 = (this->m_elements).m_data;
  while( true ) {
    if (x == pcVar2[x].m_id) break;
    iVar1 = pcVar2[pcVar2[x].m_id].m_id;
    pcVar2[x].m_id = iVar1;
    x = iVar1;
  }
  return x;
}

Assistant:

int find(int x)
	{
		//cbtAssert(x < m_N);
		//cbtAssert(x >= 0);

		while (x != m_elements[x].m_id)
		{
			//not really a reason not to use path compression, and it flattens the trees/improves find performance dramatically

#ifdef USE_PATH_COMPRESSION
			const cbtElement* elementPtr = &m_elements[m_elements[x].m_id];
			m_elements[x].m_id = elementPtr->m_id;
			x = elementPtr->m_id;
#else  //
			x = m_elements[x].m_id;
#endif
			//cbtAssert(x < m_N);
			//cbtAssert(x >= 0);
		}
		return x;
	}